

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseTimezone(char *zDate,DateTime *p)

{
  char cVar1;
  int iVar2;
  int local_2c;
  int c;
  int nMn;
  int nHr;
  int sgn;
  DateTime *p_local;
  char *zDate_local;
  
  p_local = (DateTime *)zDate;
  while ((""[(byte)p_local->iJD] & 1) != 0) {
    p_local = (DateTime *)((long)&p_local->iJD + 1);
  }
  p->tz = 0;
  cVar1 = (char)p_local->iJD;
  _nHr = p;
  if (cVar1 == '-') {
    nMn = -1;
  }
  else {
    if (cVar1 != '+') {
      if ((cVar1 != 'Z') && (cVar1 != 'z')) {
        return (uint)(cVar1 != '\0');
      }
      p_local = (DateTime *)((long)&p_local->iJD + 1);
      goto LAB_0026976c;
    }
    nMn = 1;
  }
  p_local = (DateTime *)((long)&p_local->iJD + 1);
  iVar2 = getDigits((char *)p_local,"20b:20e",&c,&local_2c);
  if (iVar2 != 2) {
    return 1;
  }
  p_local = (DateTime *)((long)&p_local->iJD + 5);
  _nHr->tz = nMn * (local_2c + c * 0x3c);
LAB_0026976c:
  while ((""[(byte)p_local->iJD] & 1) != 0) {
    p_local = (DateTime *)((long)&p_local->iJD + 1);
  }
  _nHr->tzSet = '\x01';
  return (uint)((char)p_local->iJD != '\0');
}

Assistant:

static int parseTimezone(const char *zDate, DateTime *p){
  int sgn = 0;
  int nHr, nMn;
  int c;
  while( sqlite3Isspace(*zDate) ){ zDate++; }
  p->tz = 0;
  c = *zDate;
  if( c=='-' ){
    sgn = -1;
  }else if( c=='+' ){
    sgn = +1;
  }else if( c=='Z' || c=='z' ){
    zDate++;
    goto zulu_time;
  }else{
    return c!=0;
  }
  zDate++;
  if( getDigits(zDate, "20b:20e", &nHr, &nMn)!=2 ){
    return 1;
  }
  zDate += 5;
  p->tz = sgn*(nMn + nHr*60);
zulu_time:
  while( sqlite3Isspace(*zDate) ){ zDate++; }
  p->tzSet = 1;
  return *zDate!=0;
}